

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

istream * operator>>(istream *i,Person *p)

{
  ostream *poVar1;
  string id1;
  string name1;
  Address a;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  string local_110;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  Address local_70;
  
  local_f0 = local_e0;
  local_e8 = 0;
  local_e0[0] = 0;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_90,"",&local_111);
  std::__cxx11::string::string((string *)&local_b0,"",&local_112);
  std::__cxx11::string::string((string *)&local_d0,"",&local_113);
  Address::Address(&local_70,&local_90,&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>(i,(string *)&local_f0);
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>(i,(string *)&local_110);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator>>(i,&local_70);
  std::__cxx11::string::_M_assign((string *)&p->name);
  Person::setId(p,&local_110);
  Address::operator=(&p->address,&local_70);
  Address::~Address(&local_70);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return i;
}

Assistant:

istream& operator >>(istream& i, Person& p) {

    string name1, id1;
    Address a("", "", "");
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    return i;
}